

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PushMacroScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  cmCommandContext *entryPointCommand;
  bool bVar1;
  Snapshot local_38;
  
  entryPointCommand =
       (this->ContextStack).
       super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
       _M_impl.super__Vector_impl_data._M_finish[-1];
  cmState::CreateMacroCallSnapshot
            (&local_38,this->GlobalGenerator->CMakeInstance->State,this->StateSnapshot,
             &entryPointCommand->Name,entryPointCommand->Line,fileName);
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  (this->StateSnapshot).State = local_38.State;
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar1 = cmState::Snapshot::IsValid(&this->StateSnapshot);
  if (bVar1) {
    PushFunctionBlockerBarrier(this);
    cmState::Snapshot::PushPolicy
              (&this->StateSnapshot,*(PolicyMap *)(pm->Status).super__Base_bitset<4UL>._M_w,true);
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x629,
                "void cmMakefile::PushMacroScope(const std::string &, const cmPolicies::PolicyMap &)"
               );
}

Assistant:

void cmMakefile::PushMacroScope(std::string const& fileName,
                                const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot =
      this->GetState()->CreateMacroCallSnapshot(
        this->StateSnapshot,
        this->ContextStack.back()->Name, this->ContextStack.back()->Line,
        fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}